

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

void __thiscall wasm::Debug::AddrExprMap::add(AddrExprMap *this,Expression *expr,Span span)

{
  size_type sVar1;
  mapped_type *ppEVar2;
  Expression *expr_local;
  AddrExprMap *this_local;
  Span span_local;
  
  this_local = (AddrExprMap *)span;
  sVar1 = std::
          unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
          ::count(&this->startMap,(key_type *)&this_local);
  if (sVar1 != 0) {
    __assert_fail("startMap.count(span.start) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                  ,0x19f,
                  "void wasm::Debug::AddrExprMap::add(Expression *, const BinaryLocations::Span)");
  }
  ppEVar2 = std::
            unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
            ::operator[](&this->startMap,(key_type *)&this_local);
  *ppEVar2 = expr;
  sVar1 = std::
          unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
          ::count(&this->endMap,(key_type *)((long)&this_local + 4));
  if (sVar1 == 0) {
    ppEVar2 = std::
              unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
              ::operator[](&this->endMap,(key_type *)((long)&this_local + 4));
    *ppEVar2 = expr;
    return;
  }
  __assert_fail("endMap.count(span.end) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-debug.cpp"
                ,0x1a1,
                "void wasm::Debug::AddrExprMap::add(Expression *, const BinaryLocations::Span)");
}

Assistant:

void add(Expression* expr, const BinaryLocations::Span span) {
    assert(startMap.count(span.start) == 0);
    startMap[span.start] = expr;
    assert(endMap.count(span.end) == 0);
    endMap[span.end] = expr;
  }